

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibrary.hpp
# Opt level: O0

Version __thiscall Diligent::DXCompilerLibrary::GetVersion(DXCompilerLibrary *this)

{
  bool bVar1;
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  DXCompilerLibrary *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = std::atomic<bool>::load(&this->m_Loaded,memory_order_seq_cst);
  if (!bVar1) {
    FormatString<char[33]>((string *)local_38,(char (*) [33])"DXCompiler library is not loaded");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetVersion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/DXCompilerLibrary.hpp"
               ,0x5d);
    std::__cxx11::string::~string((string *)local_38);
  }
  return this->m_Version;
}

Assistant:

Version GetVersion() const
    {
        VERIFY(m_Loaded.load(), "DXCompiler library is not loaded");
        return m_Version;
    }